

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void open_local_endpoint(connection *conn,int skip_user)

{
  uint *puVar1;
  mg_handler_t p_Var2;
  mg_server *pmVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *__s;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  undefined7 uVar12;
  size_t sVar10;
  FILE *pFVar11;
  char *__s_00;
  char *pcVar13;
  vec *buf;
  int iVar14;
  mg_connection *c;
  unsigned_short port;
  int n;
  file_stat_t st;
  char path [8192];
  char addr [1000];
  ushort local_410a;
  char *local_4108;
  vec local_4100;
  char *local_40f0;
  char *local_40e8;
  mg_connection *local_40e0;
  char *local_40d8;
  char *local_40d0;
  file_stat_t local_40c8;
  char local_4038 [2];
  char acStack_4036 [8190];
  vec local_2038 [512];
  
  conn->endpoint_type = EP_NONE;
  p_Var2 = conn->server->event_handler;
  if ((p_Var2 != (mg_handler_t)0x0) &&
     ((conn->server == (mg_server *)0x0 || conn == (connection *)0x0 ||
      (iVar4 = (*p_Var2)(&conn->mg_conn,MG_AUTH), iVar4 == 0)))) {
    mg_send_digest_auth_request(&conn->mg_conn);
    return;
  }
  if ((skip_user == 0) && (conn->server->event_handler != (mg_handler_t)0x0)) {
    conn->endpoint_type = EP_USER;
    return;
  }
  c = &conn->mg_conn;
  pcVar8 = (conn->mg_conn).request_method;
  iVar4 = strcmp(pcVar8,"CONNECT");
  if (iVar4 == 0) {
LAB_0010bc55:
    pcVar8 = conn->server->config_options[8];
    if ((pcVar8 == (char *)0x0) || (iVar4 = strcmp(pcVar8,"yes"), iVar4 != 0)) {
      send_http_error(conn,0x195,(char *)0x0);
      return;
    }
    local_410a = 0x50;
    local_4100.ptr._0_4_ = 0;
    pcVar8 = (conn->mg_conn).uri;
    local_4038[0] = '\0';
    local_40c8.st_dev._0_1_ = 0;
    iVar4 = __isoc99_sscanf(pcVar8,"%499[^: ]:%hu%n");
    if (((iVar4 != 2) &&
        (iVar4 = __isoc99_sscanf(pcVar8,"%9[a-z]://%499[^: ]:%hu%n",&local_40c8,local_4038,
                                 &local_410a,&local_4100), iVar4 != 3)) &&
       (iVar4 = __isoc99_sscanf(pcVar8,"%9[a-z]://%499[^/ ]%n",&local_40c8,local_4038,&local_4100),
       iVar4 != 2)) {
      local_4100.ptr._0_4_ = 0;
    }
    pcVar8 = "ssl";
    if (conn->ns_conn->ssl == (SSL *)0x0) {
      pcVar8 = "tcp";
    }
    snprintf((char *)local_2038,1000,"%s://%s:%hu",pcVar8,local_4038,(ulong)local_410a);
    if ((0 < (int)local_4100.ptr) && (iVar4 = mg_forward(c,(char *)local_2038), iVar4 != 0)) {
      return;
    }
    puVar1 = &conn->ns_conn->flags;
    *puVar1 = *puVar1 | 0x10;
    return;
  }
  pcVar13 = (conn->mg_conn).uri;
  iVar4 = mg_strncasecmp(pcVar13,"http",4);
  if (iVar4 == 0) goto LAB_0010bc55;
  iVar4 = strcmp(pcVar8,"OPTIONS");
  if (iVar4 == 0) {
    (conn->mg_conn).status_code = 200;
    mg_printf(c,"%s",
              "HTTP/1.1 200 OK\r\nAllow: GET, POST, HEAD, CONNECT, PUT, DELETE, OPTIONS, PROPFIND, MKCOL\r\nDAV: 1\r\n\r\n"
             );
    close_local_endpoint(conn);
    return;
  }
  pmVar3 = conn->server;
  local_40e8 = pmVar3->config_options[0x11];
  pcVar8 = pmVar3->config_options[4];
  __s_00 = pmVar3->config_options[6];
  __s = mg_get_header(c,"Host");
  if (__s_00 == (char *)0x0) {
    pcVar7 = (char *)0x0;
    pcVar9 = __s;
  }
  else {
    pcVar7 = (char *)strlen(__s_00);
    pcVar9 = pcVar7;
  }
  pcVar9 = (char *)CONCAT71((int7)((ulong)pcVar9 >> 8),local_40e8 != (char *)0x0);
  local_40d0 = pcVar8;
  if (__s != (char *)0x0 && local_40e8 != (char *)0x0) {
    local_40f0 = __s_00;
    local_40d8 = pcVar7;
    pcVar8 = strchr(__s,0x3a);
    local_4108 = __s;
    if (pcVar8 == (char *)0x0) {
      sVar10 = strlen(__s);
      iVar4 = (int)sVar10;
    }
    else {
      iVar4 = (int)pcVar8 - (int)__s;
    }
    pcVar9 = next_option(local_40e8,local_2038,&local_4100);
    __s_00 = local_40f0;
    pcVar7 = local_40d8;
    if (pcVar9 != (char *)0x0) {
      local_40e8 = (char *)(long)iVar4;
      pcVar8 = pcVar9;
      local_40e0 = c;
      do {
        if (((1 < local_2038[0].len) && (*local_2038[0].ptr == '@')) &&
           (local_2038[0].len == iVar4 + 1)) {
          uVar5 = mg_strncasecmp(local_2038[0].ptr + 1,local_4108,(size_t)local_40e8);
          pcVar9 = (char *)(ulong)uVar5;
          if (uVar5 == 0) {
            __s_00 = (char *)CONCAT44(local_4100.ptr._4_4_,(int)local_4100.ptr);
            pcVar7 = (char *)(ulong)(uint)local_4100.len;
            c = local_40e0;
            goto LAB_0010bef8;
          }
        }
        pcVar8 = next_option(pcVar8,local_2038,&local_4100);
      } while (pcVar8 != (char *)0x0);
      pcVar9 = (char *)0x0;
      __s_00 = local_40f0;
      pcVar7 = local_40d8;
      c = local_40e0;
    }
  }
LAB_0010bef8:
  uVar12 = (undefined7)((ulong)pcVar9 >> 8);
  iVar4 = 0;
  if ((int)pcVar7 == 0 || __s_00 == (char *)0x0) {
    local_4108 = (char *)CONCAT44(local_4108._4_4_,(int)CONCAT71(uVar12,1));
  }
  else {
    local_4108 = (char *)CONCAT44(local_4108._4_4_,(int)CONCAT71(uVar12,1));
    local_40f0 = __s_00;
    mg_snprintf(local_4038,0x2000,"%.*s%s",(ulong)pcVar7 & 0xffffffff,__s_00,pcVar13);
    pcVar8 = conn->server->config_options[0x11];
    do {
      pcVar8 = next_option(pcVar8,local_2038,&local_4100);
      if (pcVar8 == (char *)0x0) goto LAB_0010bfc0;
      uVar5 = mg_match_prefix(local_2038[0].ptr,local_2038[0].len,pcVar13);
    } while ((int)uVar5 < 1);
    mg_snprintf(local_4038,0x2000,"%.*s%s",(ulong)(uint)local_4100.len,
                CONCAT44(local_4100.ptr._4_4_,(int)local_4100.ptr),pcVar13 + uVar5);
LAB_0010bfc0:
    iVar6 = stat64(local_4038,(stat64 *)&local_40c8);
    iVar4 = 1;
    if (iVar6 != 0) {
      sVar10 = strlen(local_40f0);
      pcVar8 = local_40d0;
      pcVar13 = acStack_4036 + sVar10;
      do {
        if (*pcVar13 == '/') {
          *pcVar13 = '\0';
          sVar10 = strlen(pcVar8);
          iVar4 = mg_match_prefix(pcVar8,(int)sVar10,local_4038);
          if ((0 < iVar4) && (iVar4 = stat64(local_4038,(stat64 *)&local_40c8), iVar4 == 0)) {
            *pcVar13 = '/';
            pcVar8 = mg_strdup(pcVar13);
            conn->path_info = pcVar8;
            *pcVar13 = '\0';
            local_4108 = (char *)((ulong)local_4108 & 0xffffffff00000000);
            iVar4 = 1;
            goto LAB_0010c081;
          }
          *pcVar13 = '/';
        }
        else if (*pcVar13 == '\0') goto LAB_0010c04a;
        pcVar13 = pcVar13 + 1;
      } while( true );
    }
    local_4108 = (char *)((ulong)local_4108 & 0xffffffff00000000);
  }
LAB_0010c081:
  iVar6 = strcmp(c->request_method,"OPTIONS");
  if (iVar6 == 0) {
    (conn->mg_conn).status_code = 200;
    mg_printf(c,"%s",
              "HTTP/1.1 200 OK\r\nAllow: GET, POST, HEAD, CONNECT, PUT, DELETE, OPTIONS, PROPFIND, MKCOL\r\nDAV: 1\r\n\r\n"
             );
LAB_0010c332:
    close_local_endpoint(conn);
  }
  else {
    pmVar3 = conn->server;
    if (pmVar3->config_options[6] != (char *)0x0) {
      iVar6 = is_dav_request(conn);
      if (iVar6 == 0) {
        buf = (vec *)pmVar3->config_options[10];
        if (buf == (vec *)0x0) {
          if ((char)local_4108 == '\0' && (local_40c8.st_mode & 0xf000) == 0x4000) {
            buf = local_2038;
            mg_snprintf((char *)buf,0x2000,"%s%c%s",local_4038,0x2f,".htpasswd");
          }
          else {
            pcVar8 = strrchr(local_4038,0x2f);
            iVar14 = (int)local_4038;
            iVar6 = (int)pcVar8;
            if (pcVar8 == (char *)0x0) {
              iVar6 = iVar14;
            }
            buf = local_2038;
            mg_snprintf((char *)buf,0x2000,"%.*s%c%s",(ulong)(uint)(iVar6 - iVar14),local_4038,0x2f,
                        ".htpasswd");
          }
        }
        pFVar11 = fopen64((char *)buf,"r");
        if (pFVar11 == (FILE *)0x0) goto LAB_0010c0ba;
        iVar6 = mg_authorize_digest(c,(FILE *)pFVar11);
        fclose(pFVar11);
        if (iVar6 != 0) goto LAB_0010c0ba;
        goto LAB_0010c32a;
      }
LAB_0010c0ba:
      iVar6 = is_dav_request(conn);
      if (iVar6 != 0) {
        pcVar8 = conn->server->config_options[5];
        pcVar13 = (conn->mg_conn).request_method;
        if ((pcVar13 == (char *)0x0) ||
           (iVar6 = strcmp(pcVar13,"PROPFIND"), iVar6 != 0 || pcVar8 != (char *)0x0)) {
          if ((pcVar8 != (char *)0x0) && (pFVar11 = fopen64(pcVar8,"r"), pFVar11 != (FILE *)0x0)) {
            iVar6 = mg_authorize_digest(c,(FILE *)pFVar11);
            fclose(pFVar11);
            if (iVar6 != 0) goto LAB_0010c136;
          }
LAB_0010c32a:
          mg_send_digest_auth_request(c);
          goto LAB_0010c332;
        }
      }
LAB_0010c136:
      iVar6 = must_hide_file(conn,local_4038);
      if (iVar6 == 0) {
        pcVar8 = c->request_method;
        iVar6 = strcmp(pcVar8,"PROPFIND");
        if (iVar6 == 0) {
          handle_propfind(conn,local_4038,&local_40c8,iVar4);
          return;
        }
        iVar6 = strcmp(pcVar8,"MKCOL");
        if (iVar6 == 0) {
          handle_mkcol(conn,local_4038);
          return;
        }
        iVar6 = strcmp(pcVar8,"DELETE");
        if (iVar6 == 0) {
          handle_delete(conn,local_4038);
          return;
        }
        iVar6 = strcmp(pcVar8,"PUT");
        if (iVar6 != 0) {
          mg_send_file_internal(c,local_4038,&local_40c8,iVar4,(char *)0x0);
          return;
        }
        handle_put(conn,local_4038);
        return;
      }
    }
    send_http_error(conn,0x194,(char *)0x0);
  }
  return;
LAB_0010c04a:
  iVar4 = 0;
  goto LAB_0010c081;
}

Assistant:

static void open_local_endpoint(struct connection *conn, int skip_user) {
#ifndef MONGOOSE_NO_FILESYSTEM
  char path[MAX_PATH_SIZE];
  file_stat_t st;
  int exists = 0;
#endif

  // If EP_USER was set in a prev call, reset it
  conn->endpoint_type = EP_NONE;

#ifndef MONGOOSE_NO_AUTH
  if (conn->server->event_handler && call_user(conn, MG_AUTH) == MG_FALSE) {
    mg_send_digest_auth_request(&conn->mg_conn);
    return;
  }
#endif

  // Call URI handler if one is registered for this URI
  if (skip_user == 0 && conn->server->event_handler != NULL) {
    conn->endpoint_type = EP_USER;
#if MONGOOSE_POST_SIZE_LIMIT > 1
    {
      const char *cl = mg_get_header(&conn->mg_conn, "Content-Length");
      if ((strcmp(conn->mg_conn.request_method, "POST") == 0 ||
           strcmp(conn->mg_conn.request_method, "PUT") == 0) &&
          (cl == NULL || to64(cl) > MONGOOSE_POST_SIZE_LIMIT)) {
        send_http_error(conn, 500, "POST size > %lu",
                        (unsigned long) MONGOOSE_POST_SIZE_LIMIT);
      }
    }
#endif
    return;
  }

  if (strcmp(conn->mg_conn.request_method, "CONNECT") == 0 ||
      mg_strncasecmp(conn->mg_conn.uri, "http", 4) == 0) {
    const char *enp = conn->server->config_options[ENABLE_PROXY];
    if (enp == NULL || strcmp(enp, "yes") != 0) {
      send_http_error(conn, 405, NULL);
    } else {
      proxify_connection(conn);
    }
    return;
  }

  if (!strcmp(conn->mg_conn.request_method, "OPTIONS")) {
    send_options(conn);
    return;
  }

#ifdef MONGOOSE_NO_FILESYSTEM
  send_http_error(conn, 404, NULL);
#else
  exists = convert_uri_to_file_name(conn, path, sizeof(path), &st);

  if (!strcmp(conn->mg_conn.request_method, "OPTIONS")) {
    send_options(conn);
  } else if (conn->server->config_options[DOCUMENT_ROOT] == NULL) {
    send_http_error(conn, 404, NULL);
#ifndef MONGOOSE_NO_AUTH
  } else if ((!is_dav_request(conn) && !is_authorized(conn, path,
               exists && S_ISDIR(st.st_mode))) ||
             (is_dav_request(conn) && !is_authorized_for_dav(conn))) {
    mg_send_digest_auth_request(&conn->mg_conn);
    close_local_endpoint(conn);
#endif
#ifndef MONGOOSE_NO_DAV
  } else if (must_hide_file(conn, path)) {
    send_http_error(conn, 404, NULL);
  } else if (!strcmp(conn->mg_conn.request_method, "PROPFIND")) {
    handle_propfind(conn, path, &st, exists);
  } else if (!strcmp(conn->mg_conn.request_method, "MKCOL")) {
    handle_mkcol(conn, path);
  } else if (!strcmp(conn->mg_conn.request_method, "DELETE")) {
    handle_delete(conn, path);
  } else if (!strcmp(conn->mg_conn.request_method, "PUT")) {
    handle_put(conn, path);
#endif
  } else {
    mg_send_file_internal(&conn->mg_conn, path, &st, exists, NULL);
  }
#endif  // MONGOOSE_NO_FILESYSTEM
}